

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMAddress.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,ROMAddress *addr)

{
  undefined4 uVar1;
  long lVar2;
  ostream *poVar3;
  
  uVar1 = *(undefined4 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18);
  *(undefined4 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) = 8;
  poVar3 = std::operator<<(stream,0x30);
  lVar2 = *(long *)poVar3;
  *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
  *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*(byte *)((long)&addr->m_Address + 2))
  ;
  poVar3 = std::operator<<(poVar3,":");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  std::ostream::operator<<(poVar3,(ushort)addr->m_Address);
  *(undefined4 *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) = uVar1;
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream &stream, const ROMAddress &addr) {
    auto flags = stream.flags(std::ios_base::hex);
    //so the address gets shown as big-endian no matter if the system is little-, middle- or big-endian
    stream << std::setfill('0') << std::uppercase << std::setw(2) << static_cast<uint16_t>(addr.bank()) << ":" << std::setw(4) << addr.bankAddress();
    stream.flags(flags);
    return stream;
}